

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accum.c
# Opt level: O2

int accum_state_mean(vector_t ***mean,float32 ***dnom,vector_t **feat,uint32 n_feat,uint32 *veclen,
                    uint32 *sseq,uint32 *ci_sseq,uint32 n_frame)

{
  uint uVar1;
  vector_t pfVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  for (uVar3 = 0; uVar3 != n_frame; uVar3 = uVar3 + 1) {
    uVar4 = 0;
    uVar6 = 0;
    if (ci_sseq != (uint32 *)0x0 && sseq != (uint32 *)0x0) {
      uVar4 = (ulong)sseq[uVar3];
      uVar6 = ci_sseq[uVar3];
    }
    for (uVar7 = 0; uVar7 != n_feat; uVar7 = uVar7 + 1) {
      *dnom[uVar4][uVar7] = (float32)((float)*dnom[uVar4][uVar7] + 1.0);
      if ((uint)uVar4 != uVar6) {
        *dnom[uVar6][uVar7] = (float32)((float)*dnom[uVar6][uVar7] + 1.0);
      }
      uVar1 = veclen[uVar7];
      for (uVar5 = 0; uVar5 < uVar1; uVar5 = uVar5 + 1) {
        pfVar2 = feat[uVar3][uVar7];
        (*mean[uVar4][uVar7])[uVar5] = pfVar2[uVar5] + (*mean[uVar4][uVar7])[uVar5];
        if ((uint)uVar4 != uVar6) {
          (*mean[uVar6][uVar7])[uVar5] = pfVar2[uVar5] + (*mean[uVar6][uVar7])[uVar5];
        }
      }
    }
  }
  return 0;
}

Assistant:

int
accum_state_mean(vector_t ***mean,
		 float32 ***dnom,
		 vector_t **feat,
		 uint32 n_feat,
		 const uint32 *veclen,
		 uint32 *sseq,
		 uint32 *ci_sseq,
		 uint32 n_frame)
{
    uint32 t;		/* time (in frames) */
    uint32 s;		/* a tied state */
    uint32 ci_s;	/* a CI tied state */
    uint32 f;		/* a feature stream idx */
    uint32 c;		/* a vector component idx */

    for (t = 0; t < n_frame; t++) {
	if (sseq && ci_sseq) {
	    s = sseq[t];
	    ci_s = ci_sseq[t];
	}
	else {
	    s = 0;
	    ci_s = 0;
	}

	for (f = 0; f < n_feat; f++) {
	    dnom[s][f][0] += 1.0;
	    if (s != ci_s) {
		dnom[ci_s][f][0] += 1.0;
	    }
	    for (c = 0; c < veclen[f]; c++) {
		/* only one Gaussian per state */
    		mean[s][f][0][c] += feat[t][f][c];

		if (s != ci_s) {
		    mean[ci_s][f][0][c] += feat[t][f][c];
		}
	    }
	}
    }
    return 0;
}